

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O0

int fl_XGetUtf8FontAndGlyph(XUtf8FontStruct *font_set,uint ucs,XFontStruct **fnt,unsigned_short *id)

{
  int *piVar1;
  XFontStruct **ppXVar2;
  int *piVar3;
  int iVar4;
  bool bVar5;
  int *ranges;
  int iStack_48;
  char glyph [2];
  int nb_font;
  int first;
  int fnum;
  XFontStruct **fonts;
  int *encodings;
  unsigned_short *id_local;
  XFontStruct **fnt_local;
  uint ucs_local;
  XUtf8FontStruct *font_set_local;
  
  ranges._4_4_ = font_set->nb_font;
  if (ranges._4_4_ < 1) {
    font_set_local._4_4_ = -1;
  }
  else {
    piVar1 = font_set->ranges;
    ppXVar2 = font_set->fonts;
    piVar3 = font_set->encodings;
    nb_font = 0;
    while( true ) {
      bVar5 = false;
      if (nb_font < ranges._4_4_) {
        bVar5 = ppXVar2[nb_font] == (XFontStruct *)0x0;
      }
      if (!bVar5) break;
      nb_font = nb_font + 1;
    }
    if (nb_font < ranges._4_4_) {
      iStack_48 = nb_font;
      while ((nb_font < ranges._4_4_ &&
             (((ppXVar2[nb_font] == (XFontStruct *)0x0 ||
               (iVar4 = ucs2fontmap((char *)((long)&ranges + 2),ucs,piVar3[nb_font]), iVar4 < 0)) ||
              ((piVar3[nb_font] == 0 &&
               (((int)ucs < piVar1[nb_font << 1] || (piVar1[nb_font * 2 + 1] < (int)ucs))))))))) {
        nb_font = nb_font + 1;
      }
      if (nb_font == ranges._4_4_) {
        nb_font = iStack_48;
        ucs2fontmap((char *)((long)&ranges + 2),0x3f,piVar3[iStack_48]);
      }
      *id = CONCAT11(ranges._2_1_,ranges._3_1_);
      *fnt = ppXVar2[nb_font];
      font_set_local._4_4_ = 0;
    }
    else {
      font_set_local._4_4_ = -1;
    }
  }
  return font_set_local._4_4_;
}

Assistant:

int
fl_XGetUtf8FontAndGlyph(XUtf8FontStruct  *font_set,
			unsigned int     ucs,
			XFontStruct      **fnt,
			unsigned short   *id) {

  int             *encodings; /* encodings array */
  XFontStruct     **fonts;    /* fonts array */
  int             fnum;       /* index of the current font in the fonts array*/
  int             first;      /* first valid font index */
  int             nb_font;    /* quantity of fonts in the font array */
  char 		  glyph[2];   /* byte1 and byte2 value of the UTF-8 char */
  int             *ranges;    /* sub range of iso10646 */

  nb_font = font_set->nb_font;

  if (nb_font < 1) {
    /* there is no font in the font_set :-( */
    return -1;
  }

  ranges = font_set->ranges;
  fonts = font_set->fonts;
  encodings = font_set->encodings;
  fnum = 0;

  while(fnum < nb_font && !fonts[fnum]) fnum++;
  if (fnum >= nb_font) {
    /* there is no valid font for the X server */
    return -1;
  }

  first = fnum;

  /*
   * find the first encoding which can be used to draw the glyph
   */
  fnum = first;
  while (fnum < nb_font) {
    if (fonts[fnum] && ucs2fontmap(glyph, ucs, encodings[fnum]) >= 0) {
      if (encodings[fnum] != 0 ||
          ((int)ucs >= ranges[fnum * 2] &&
	   (int)ucs <= ranges[fnum * 2 + 1])) {
	break;
      }
    }
    fnum++;
  }
  if (fnum == nb_font) {
    /* the char is not valid in all encodings ->
     * draw it using the first font :-(
     */
    fnum = first;
    ucs2fontmap(glyph, '?', encodings[fnum]);
  }

  *id = ((unsigned char)glyph[0] << 8) | (unsigned char)glyph[1] ;
  *fnt = fonts[fnum];
  return 0;
}